

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void capnp::compiler::findImports
               (Reader decl,
               set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *output)

{
  Reader exp;
  Reader decl_00;
  Reader exp_00;
  Reader paramList;
  Reader paramList_00;
  ListElementCount LVar1;
  CapTableReader *pCVar2;
  ElementCount EVar3;
  SegmentReader *pSVar4;
  StructReader *__return_storage_ptr__;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Reader superclass;
  StructReader local_1d8;
  ListReader local_1a8;
  PointerReader local_178;
  StructReader local_150;
  StructReader local_120;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  if (decl._reader.dataSize < 0x20) goto switchD_00119cad_caseD_3;
  switch(*(undefined2 *)((long)decl._reader.data + 2)) {
  case 1:
    local_1a8.ptr = (byte *)(decl._reader.pointers + 5);
    if (decl._reader.pointerCount < 6) {
      local_1a8.ptr = (byte *)(WirePointer *)0x0;
    }
    uVar5 = decl._reader.segment._0_4_;
    uVar6 = decl._reader.segment._4_4_;
    uVar7 = decl._reader.capTable._0_4_;
    uVar8 = decl._reader.capTable._4_4_;
    local_1a8.elementCount = decl._reader.nestingLimit;
    if (decl._reader.pointerCount < 6) {
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      local_1a8.elementCount = 0x7fffffff;
    }
    local_1a8.segment = (SegmentReader *)CONCAT44(uVar6,uVar5);
    local_1a8.capTable = (CapTableReader *)CONCAT44(uVar8,uVar7);
    __return_storage_ptr__ = &local_60;
    break;
  case 2:
    local_1a8.ptr = (byte *)(decl._reader.pointers + 5);
    if (decl._reader.pointerCount < 6) {
      local_1a8.ptr = (byte *)(WirePointer *)0x0;
    }
    uVar5 = decl._reader.segment._0_4_;
    uVar6 = decl._reader.segment._4_4_;
    uVar7 = decl._reader.capTable._0_4_;
    uVar8 = decl._reader.capTable._4_4_;
    local_1a8.elementCount = decl._reader.nestingLimit;
    if (decl._reader.pointerCount < 6) {
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      local_1a8.elementCount = 0x7fffffff;
    }
    local_1a8.segment = (SegmentReader *)CONCAT44(uVar6,uVar5);
    local_1a8.capTable = (CapTableReader *)CONCAT44(uVar8,uVar7);
    __return_storage_ptr__ = &local_90;
    break;
  default:
    goto switchD_00119cad_caseD_3;
  case 6:
    local_1a8.ptr = (byte *)(decl._reader.pointers + 5);
    if (decl._reader.pointerCount < 6) {
      local_1a8.ptr = (byte *)(WirePointer *)0x0;
    }
    uVar5 = decl._reader.segment._0_4_;
    uVar6 = decl._reader.segment._4_4_;
    uVar7 = decl._reader.capTable._0_4_;
    uVar8 = decl._reader.capTable._4_4_;
    local_1a8.elementCount = decl._reader.nestingLimit;
    if (decl._reader.pointerCount < 6) {
      uVar5 = 0;
      uVar6 = 0;
      uVar7 = 0;
      uVar8 = 0;
      local_1a8.elementCount = 0x7fffffff;
    }
    local_1a8.segment = (SegmentReader *)CONCAT44(uVar6,uVar5);
    local_1a8.capTable = (CapTableReader *)CONCAT44(uVar8,uVar7);
    __return_storage_ptr__ = &local_c0;
    break;
  case 9:
    local_1d8.data = decl._reader.pointers + 5;
    if (decl._reader.pointerCount < 6) {
      local_1d8.data = (WirePointer *)0x0;
    }
    local_1d8.segment._0_4_ = decl._reader.segment._0_4_;
    local_1d8.segment._4_4_ = decl._reader.segment._4_4_;
    local_1d8.capTable._0_4_ = decl._reader.capTable._0_4_;
    local_1d8.capTable._4_4_ = decl._reader.capTable._4_4_;
    local_1d8.pointers._0_4_ = decl._reader.nestingLimit;
    if (decl._reader.pointerCount < 6) {
      local_1d8.segment._0_4_ = 0;
      local_1d8.segment._4_4_ = 0;
      local_1d8.capTable._0_4_ = 0;
      local_1d8.capTable._4_4_ = 0;
      local_1d8.pointers._0_4_ = 0x7fffffff;
    }
    capnp::_::PointerReader::getList
              (&local_1a8,(PointerReader *)&local_1d8,INLINE_COMPOSITE,(word *)0x0);
    LVar1 = local_1a8.elementCount;
    if (local_1a8.elementCount != 0) {
      EVar3 = 0;
      do {
        capnp::_::ListReader::getStructElement(&local_1d8,&local_1a8,EVar3);
        exp_00._reader.segment._4_4_ = local_1d8.segment._4_4_;
        exp_00._reader.segment._0_4_ = local_1d8.segment._0_4_;
        exp_00._reader.capTable._4_4_ = local_1d8.capTable._4_4_;
        exp_00._reader.capTable._0_4_ = local_1d8.capTable._0_4_;
        exp_00._reader.pointers._4_4_ = local_1d8.pointers._4_4_;
        exp_00._reader.pointers._0_4_ = (int)local_1d8.pointers;
        exp_00._reader.pointerCount = local_1d8.pointerCount;
        exp_00._reader.dataSize = local_1d8.dataSize;
        exp_00._reader._38_2_ = local_1d8._38_2_;
        exp_00._reader._44_4_ = local_1d8._44_4_;
        exp_00._reader.nestingLimit = local_1d8.nestingLimit;
        exp_00._reader.data = local_1d8.data;
        findImports(exp_00,output);
        EVar3 = EVar3 + 1;
      } while (LVar1 != EVar3);
    }
    goto switchD_00119cad_caseD_3;
  case 10:
    pSVar4 = decl._reader.segment;
    pCVar2 = decl._reader.capTable;
    if (decl._reader.pointerCount < 6) {
      local_1a8.elementCount = 0x7fffffff;
      local_1a8.capTable = (CapTableReader *)0x0;
      local_1a8.ptr = (byte *)0x0;
      local_1a8.segment = (SegmentReader *)0x0;
    }
    else {
      local_1a8.ptr = (byte *)(decl._reader.pointers + 5);
      local_1a8.capTable = pCVar2;
      local_1a8.segment = pSVar4;
      local_1a8.elementCount = decl._reader.nestingLimit;
    }
    capnp::_::PointerReader::getStruct(&local_f0,(PointerReader *)&local_1a8,(word *)0x0);
    paramList._reader.capTable = local_f0.capTable;
    paramList._reader.segment = local_f0.segment;
    paramList._reader.data = local_f0.data;
    paramList._reader.pointers = local_f0.pointers;
    paramList._reader.dataSize = local_f0.dataSize;
    paramList._reader.pointerCount = local_f0.pointerCount;
    paramList._reader._38_2_ = local_f0._38_2_;
    paramList._reader.nestingLimit = local_f0.nestingLimit;
    paramList._reader._44_4_ = local_f0._44_4_;
    findImports(paramList,output);
    if ((0x6f < decl._reader.dataSize) && (*(short *)((long)decl._reader.data + 0xc) == 1)) {
      if (decl._reader.pointerCount < 7) {
        local_1a8.elementCount = 0x7fffffff;
        pCVar2 = (CapTableReader *)0x0;
        local_1a8.ptr = (byte *)0x0;
        pSVar4 = (SegmentReader *)0x0;
      }
      else {
        local_1a8.ptr = (byte *)(decl._reader.pointers + 6);
        local_1a8.elementCount = decl._reader.nestingLimit;
      }
      local_1a8.segment = pSVar4;
      local_1a8.capTable = pCVar2;
      capnp::_::PointerReader::getStruct(&local_120,(PointerReader *)&local_1a8,(word *)0x0);
      paramList_00._reader.capTable = local_120.capTable;
      paramList_00._reader.segment = local_120.segment;
      paramList_00._reader.data = local_120.data;
      paramList_00._reader.pointers = local_120.pointers;
      paramList_00._reader.dataSize = local_120.dataSize;
      paramList_00._reader.pointerCount = local_120.pointerCount;
      paramList_00._reader._38_2_ = local_120._38_2_;
      paramList_00._reader.nestingLimit = local_120.nestingLimit;
      paramList_00._reader._44_4_ = local_120._44_4_;
      findImports(paramList_00,output);
    }
    goto switchD_00119cad_caseD_3;
  }
  capnp::_::PointerReader::getStruct(__return_storage_ptr__,(PointerReader *)&local_1a8,(word *)0x0)
  ;
  findImports((Reader)*__return_storage_ptr__,output);
switchD_00119cad_caseD_3:
  local_1d8.data = decl._reader.pointers + 3;
  if (decl._reader.pointerCount < 4) {
    local_1d8.data = (WirePointer *)0x0;
  }
  local_1d8.segment._0_4_ = decl._reader.segment._0_4_;
  local_1d8.segment._4_4_ = decl._reader.segment._4_4_;
  local_1d8.capTable._0_4_ = decl._reader.capTable._0_4_;
  local_1d8.capTable._4_4_ = decl._reader.capTable._4_4_;
  local_1d8.pointers._0_4_ = decl._reader.nestingLimit;
  if (decl._reader.pointerCount < 4) {
    local_1d8.segment._0_4_ = 0;
    local_1d8.segment._4_4_ = 0;
    local_1d8.capTable._0_4_ = 0;
    local_1d8.capTable._4_4_ = 0;
    local_1d8.pointers._0_4_ = 0x7fffffff;
  }
  capnp::_::PointerReader::getList
            (&local_1a8,(PointerReader *)&local_1d8,INLINE_COMPOSITE,(word *)0x0);
  LVar1 = local_1a8.elementCount;
  if (local_1a8.elementCount != 0) {
    EVar3 = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_1d8,&local_1a8,EVar3);
      local_178.pointer = (WirePointer *)CONCAT44(local_1d8.pointers._4_4_,(int)local_1d8.pointers);
      local_178.nestingLimit = local_1d8.nestingLimit;
      if (local_1d8.pointerCount == 0) {
        local_178.pointer = (WirePointer *)0x0;
        local_178.nestingLimit = 0x7fffffff;
      }
      local_178.segment._0_4_ = 0;
      local_178.segment._4_4_ = 0;
      local_178.capTable._0_4_ = 0;
      local_178.capTable._4_4_ = 0;
      if (local_1d8.pointerCount != 0) {
        local_178.segment._0_4_ = local_1d8.segment._0_4_;
        local_178.segment._4_4_ = local_1d8.segment._4_4_;
        local_178.capTable._0_4_ = local_1d8.capTable._0_4_;
        local_178.capTable._4_4_ = local_1d8.capTable._4_4_;
      }
      capnp::_::PointerReader::getStruct(&local_150,&local_178,(word *)0x0);
      exp._reader.capTable = local_150.capTable;
      exp._reader.segment = local_150.segment;
      exp._reader.data = local_150.data;
      exp._reader.pointers = local_150.pointers;
      exp._reader.dataSize = local_150.dataSize;
      exp._reader.pointerCount = local_150.pointerCount;
      exp._reader._38_2_ = local_150._38_2_;
      exp._reader.nestingLimit = local_150.nestingLimit;
      exp._reader._44_4_ = local_150._44_4_;
      findImports(exp,output);
      EVar3 = EVar3 + 1;
    } while (LVar1 != EVar3);
  }
  local_1d8.data = decl._reader.pointers + 2;
  if (decl._reader.pointerCount < 3) {
    local_1d8.data = (WirePointer *)0x0;
  }
  if (decl._reader.pointerCount < 3) {
    decl._reader.segment._0_4_ = 0;
    decl._reader.segment._4_4_ = 0;
    decl._reader.capTable._0_4_ = 0;
    decl._reader.capTable._4_4_ = 0;
    decl._reader.nestingLimit = 0x7fffffff;
  }
  local_1d8.segment._0_4_ = decl._reader.segment._0_4_;
  local_1d8.segment._4_4_ = decl._reader.segment._4_4_;
  local_1d8.capTable._0_4_ = decl._reader.capTable._0_4_;
  local_1d8.capTable._4_4_ = decl._reader.capTable._4_4_;
  local_1d8.pointers._0_4_ = decl._reader.nestingLimit;
  capnp::_::PointerReader::getList
            (&local_1a8,(PointerReader *)&local_1d8,INLINE_COMPOSITE,(word *)0x0);
  LVar1 = local_1a8.elementCount;
  if (local_1a8.elementCount != 0) {
    EVar3 = 0;
    do {
      capnp::_::ListReader::getStructElement(&local_1d8,&local_1a8,EVar3);
      decl_00._reader.segment._4_4_ = local_1d8.segment._4_4_;
      decl_00._reader.segment._0_4_ = local_1d8.segment._0_4_;
      decl_00._reader.capTable._4_4_ = local_1d8.capTable._4_4_;
      decl_00._reader.capTable._0_4_ = local_1d8.capTable._0_4_;
      decl_00._reader.pointers._4_4_ = local_1d8.pointers._4_4_;
      decl_00._reader.pointers._0_4_ = (int)local_1d8.pointers;
      decl_00._reader.pointerCount = local_1d8.pointerCount;
      decl_00._reader.dataSize = local_1d8.dataSize;
      decl_00._reader._38_2_ = local_1d8._38_2_;
      decl_00._reader._44_4_ = local_1d8._44_4_;
      decl_00._reader.nestingLimit = local_1d8.nestingLimit;
      decl_00._reader.data = local_1d8.data;
      findImports(decl_00,output);
      EVar3 = EVar3 + 1;
    } while (LVar1 != EVar3);
  }
  return;
}

Assistant:

static void findImports(Declaration::Reader decl, std::set<kj::StringPtr>& output) {
  switch (decl.which()) {
    case Declaration::USING:
      findImports(decl.getUsing().getTarget(), output);
      break;
    case Declaration::CONST:
      findImports(decl.getConst().getType(), output);
      break;
    case Declaration::FIELD:
      findImports(decl.getField().getType(), output);
      break;
    case Declaration::INTERFACE:
      for (auto superclass: decl.getInterface().getSuperclasses()) {
        findImports(superclass, output);
      }
      break;
    case Declaration::METHOD: {
      auto method = decl.getMethod();

      findImports(method.getParams(), output);
      if (method.getResults().isExplicit()) {
        findImports(method.getResults().getExplicit(), output);
      }
      break;
    }
    default:
      break;
  }

  for (auto ann: decl.getAnnotations()) {
    findImports(ann.getName(), output);
  }

  for (auto nested: decl.getNestedDecls()) {
    findImports(nested, output);
  }
}